

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetInputSource.cc
# Opt level: O0

void __thiscall OffsetInputSource::seek(OffsetInputSource *this,qpdf_offset_t offset,int whence)

{
  ostream *poVar1;
  range_error *this_00;
  element_type *peVar2;
  int extraout_var;
  runtime_error *this_01;
  string local_1d0 [48];
  locale local_1a0 [8];
  ostringstream local_198 [8];
  ostringstream msg;
  int whence_local;
  qpdf_offset_t offset_local;
  OffsetInputSource *this_local;
  
  if (whence == 0) {
    if (this->max_safe_offset < offset) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::locale::classic();
      std::ios::imbue(local_1a0);
      std::locale::~locale(local_1a0);
      poVar1 = std::operator<<((ostream *)local_198,"seeking to ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,offset);
      poVar1 = std::operator<<(poVar1," offset by ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->global_offset);
      std::operator<<(poVar1," would cause an overflow of the offset type");
      this_00 = (range_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::range_error::range_error(this_00,local_1d0);
      __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
    }
    peVar2 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->proxied);
    (*peVar2->_vptr_InputSource[5])(peVar2,offset + this->global_offset,0);
  }
  else {
    peVar2 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->proxied);
    (*peVar2->_vptr_InputSource[5])(peVar2,offset,(ulong)(uint)whence);
  }
  (*(this->super_InputSource)._vptr_InputSource[4])();
  if (extraout_var < 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"offset input source: seek before beginning of file");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void
OffsetInputSource::seek(qpdf_offset_t offset, int whence)
{
    if (whence == SEEK_SET) {
        if (offset > this->max_safe_offset) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "seeking to " << offset << " offset by " << global_offset
                << " would cause an overflow of the offset type";
            throw std::range_error(msg.str());
        }
        this->proxied->seek(offset + global_offset, whence);
    } else {
        this->proxied->seek(offset, whence);
    }
    if (tell() < 0) {
        throw std::runtime_error("offset input source: seek before beginning of file");
    }
}